

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_func_sig_return_test.c
# Opt level: O3

int main(void)

{
  int iVar1;
  __pid_t _Var2;
  uint *puVar3;
  char *pcVar4;
  int i;
  uint uVar5;
  int local_1c [2];
  int wait_ret;
  
  main_pid = getpid();
  uVar5 = 0;
  log_formatted("Parent pid is %d",(ulong)(uint)main_pid);
  sigemptyset((sigset_t *)&action.sa_mask);
  action.sa_flags = 0;
  action.__sigaction_handler.sa_handler = catch_async_return;
  iVar1 = __libc_current_sigrtmin();
  iVar1 = sigaction(iVar1 + 1,(sigaction *)&action,(sigaction *)0x0);
  if (iVar1 == -1) {
    log_formatted("Error in setup");
LAB_00101422:
    exit(1);
  }
  do {
    long_async_func(uVar5 & 1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 1000);
  if (await_forks != 0) {
    do {
      local_1c[0] = 0;
      _Var2 = wait(local_1c);
      if ((_Var2 == -1) || (local_1c[0] != 0)) {
        puVar3 = (uint *)__errno_location();
        uVar5 = *puVar3;
        pcVar4 = strerror(uVar5);
        log_formatted("Parent received failure: %d, %s",(ulong)uVar5,pcVar4);
        goto LAB_00101422;
      }
      await_forks = await_forks - 1;
    } while (await_forks != 0);
  }
  log_formatted("Parent received # of returned values: %d\n",comm_sumary.acc);
  return 0;
}

Assistant:

int main() {
    int tmp_err = 0;
    main_pid = getpid();
    log_formatted("Parent pid is %d", main_pid);

    // setup signal handlers
    sigemptyset(&action.sa_mask);
    action.sa_flags = 0;
    action.sa_handler = catch_async_return;

    tmp_err = sigaction(NOTIFY_SIG, &action, NULL);
    if(tmp_err == -1) {
        log_formatted("Error in setup");
        exit(EXIT_FAILURE);
    }

    // create workers
    for(int i=0; i<N_FORKS; i++) {
        long_async_func(i%2);
    }

    // wait for workers to finish
    while (await_forks) {
        int wait_ret = EXIT_SUCCESS;
        pid_t tmp_pid = wait(&wait_ret);
        if(tmp_pid == -1 || wait_ret != EXIT_SUCCESS) {
            log_formatted("Parent received failure: %d, %s", errno, strerror(errno));
            exit(EXIT_FAILURE);
        }
        await_forks--;
    }
    log_formatted("Parent received # of returned values: %d\n", comm_sumary.acc);
    assert(comm_sumary.acc == N_FORKS/2);
    return 0;
}